

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_untransformed_rgb565(int count,QT_FT_Span *spans,void *userData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QThreadPool *pQVar4;
  ulong uVar5;
  QT_FT_Span *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int cn;
  int i;
  int c;
  QThreadPool *threadPool;
  int segments;
  int yoff;
  int xoff;
  int image_height;
  int image_width;
  CompositionMode mode;
  QSpanData *data;
  QSemaphore semaphore;
  anon_class_32_6_a7326c45 function;
  undefined4 in_stack_ffffffffffffff68;
  int iVar6;
  int iVar7;
  undefined1 *local_30 [3];
  int local_18;
  int iStack_14;
  int local_10;
  int iStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = *(int *)(*(long *)in_RDX + 0xc);
  if ((in_RDX[0xd].x == 7) && ((iVar7 == 0 || (iVar7 == 3)))) {
    iVar6 = in_RDX[0xb].x;
    iVar3 = in_RDX[0xb].len;
    iVar1 = qRound(5.93050067568909e-317);
    iVar1 = -iVar1;
    iVar2 = qRound(5.93052439084009e-317);
    _local_18 = CONCAT44(-iVar2,iVar1);
    _local_10 = CONCAT44(iVar6,iVar3);
    iVar2 = (in_EDI + 0x20) / 0x40;
    pQVar4 = QGuiApplicationPrivate::qtGuiThreadPool();
    if ((1 < iVar2) &&
       ((2 < (int)qPixelLayouts[*(uint *)(*(long *)in_RDX + 0x10)].bpp &&
        (pQVar4 != (QThreadPool *)0x0)))) {
      QThread::currentThread();
      uVar5 = QThreadPool::contains((QThread *)pQVar4);
      if ((uVar5 & 1) == 0) {
        local_30[0] = &DAT_aaaaaaaaaaaaaaaa;
        QSemaphore::QSemaphore((QSemaphore *)local_30,0);
        iVar7 = 0;
        for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
          iVar3 = (in_EDI - iVar7) / (iVar2 - iVar6);
          QThreadPool::
          start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4680:5),_true>
                    ((QThreadPool *)CONCAT44(iVar7,iVar6),
                     (anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar3,in_stack_ffffffffffffff68),
                     (int)((ulong)pQVar4 >> 0x20));
          iVar7 = iVar3 + iVar7;
        }
        QSemaphore::acquire((int)local_30);
        QSemaphore::~QSemaphore((QSemaphore *)local_30);
        goto LAB_00b72a8e;
      }
    }
    blend_untransformed_rgb565::anon_class_32_6_a7326c45::operator()
              ((anon_class_32_6_a7326c45 *)CONCAT44(iVar7,iVar6),iVar3,iVar1);
  }
  else {
    blend_untransformed_generic((int)((ulong)in_RSI >> 0x20),in_RDX,in_RDX);
  }
LAB_00b72a8e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_untransformed_rgb565(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData*>(userData);
    QPainter::CompositionMode mode = data->rasterBuffer->compositionMode;

    if (data->texture.format != QImage::Format_RGB16
            || (mode != QPainter::CompositionMode_SourceOver
                && mode != QPainter::CompositionMode_Source))
    {
        blend_untransformed_generic(count, spans, userData);
        return;
    }

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx);
    int yoff = -qRound(-data->dy);

    auto function = [=](int cStart, int cEnd)
    {
        for (int c = cStart; c < cEnd; ++c) {
            if (!spans[c].len)
                continue;
            const quint8 coverage = (data->texture.const_alpha * spans[c].coverage) >> 8;
            if (coverage == 0)
                continue;

            int x = spans[c].x;
            int length = spans[c].len;
            int sx = xoff + x;
            int sy = yoff + spans[c].y;
            if (sy >= 0 && sy < image_height && sx < image_width) {
                if (sx < 0) {
                    x -= sx;
                    length += sx;
                    sx = 0;
                }
                if (sx + length > image_width)
                    length = image_width - sx;
                if (length > 0) {
                    quint16 *dest = (quint16 *)data->rasterBuffer->scanLine(spans[c].y) + x;
                    const quint16 *src = (const quint16 *)data->texture.scanLine(sy) + sx;
                    if (coverage == 255) {
                        memcpy(dest, src, length * sizeof(quint16));
                    } else {
                        const quint8 alpha = (coverage + 1) >> 3;
                        const quint8 ialpha = 0x20 - alpha;
                        if (alpha > 0)
                            blend_sourceOver_rgb16_rgb16(dest, src, length, alpha, ialpha);
                    }
                }
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}